

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O3

void __thiscall
pstore::serialize::archive::database_reader::get<unsigned_long,void>
          (database_reader *this,unsigned_long *v)

{
  value_type vVar1;
  _func_int **local_28;
  __uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  local_20;
  
  vVar1 = (this->addr_).a_;
  vVar1 = (vVar1 + 7 & 0xfffffffffffffff8) - vVar1;
  if (vVar1 < 8) {
    address::operator+=(&this->addr_,vVar1);
    database::getrou<unsigned_long,void>
              ((database *)&stack0xffffffffffffffd8,(typed_address<unsigned_long>)this->db_,
               (this->addr_).a_);
    address::operator+=(&this->addr_,8);
    *v = *(unsigned_long *)
          local_20._M_t.
          super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
          .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
    (*(code *)local_28)();
    return;
  }
  assert_failed("extra_for_alignment < sizeof (Ty)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/db_archive.hpp"
                ,0x94);
}

Assistant:

void database_reader::get (Ty & v) {

                auto const extra_for_alignment = calc_alignment (addr_.absolute (), alignof (Ty));
                PSTORE_ASSERT (extra_for_alignment < sizeof (Ty));
                addr_ += extra_for_alignment;
                // Load the data.
                auto result = db_.getrou (typed_address<Ty> (addr_));
                addr_ += sizeof (Ty);
                // Copy to the destination.
                new (&v) Ty (*result);
            }